

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

PackageImportDeclarationSyntax * __thiscall
slang::parsing::Parser::parseImportDeclaration(Parser *this,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_00;
  Token keyword_00;
  Token semi_00;
  int iVar1;
  undefined4 extraout_var;
  PackageImportDeclarationSyntax *pPVar3;
  EVP_PKEY_CTX *src;
  undefined8 extraout_RDX;
  ParserBase *in_RDI;
  PackageImportDeclarationSyntax *result;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> items;
  Token semi;
  Token keyword;
  Token *in_stack_fffffffffffffe10;
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *this_00;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe1c;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe20;
  ParserBase *in_stack_fffffffffffffe30;
  undefined8 uVar5;
  RequireItems in_stack_ffffffffffffff24;
  Token *in_stack_ffffffffffffff28;
  TokenKind in_stack_ffffffffffffff34;
  TokenKind in_stack_ffffffffffffff36;
  SmallVectorBase<slang::syntax::TokenOrSyntax> *in_stack_ffffffffffffff38;
  DiagCode in_stack_ffffffffffffff50;
  SyntaxNode *in_stack_ffffffffffffff58;
  AllowEmpty in_stack_ffffffffffffff60;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_38;
  vector<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
  *pvStack_30;
  Info *pIVar2;
  
  ParserBase::consume(in_stack_fffffffffffffe30);
  Token::Token(in_stack_fffffffffffffe10);
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x8aa325);
  this_00 = (SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *)&stack0xffffffffffffff40;
  uVar4 = 0;
  ParserBase::
  parseList<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isSemicolon,slang::parsing::Parser::parseImportDeclaration(std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>)::__0>
            (in_RDI,in_stack_ffffffffffffff38,in_stack_ffffffffffffff36,in_stack_ffffffffffffff34,
             in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff50,
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
  elements._M_ptr._4_4_ = in_stack_fffffffffffffe1c;
  elements._M_ptr._0_4_ = uVar4;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffe20._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this_00,elements);
  iVar1 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&stack0xffffffffffffff50,
                     (EVP_PKEY_CTX *)in_RDI->alloc,src);
  pIVar2 = (Info *)CONCAT44(extraout_var,iVar1);
  elements_00._M_ptr._4_4_ = in_stack_fffffffffffffe1c;
  elements_00._M_ptr._0_4_ = uVar4;
  elements_00._M_extent._M_extent_value = in_stack_fffffffffffffe20._M_extent_value;
  uVar5 = extraout_RDX;
  slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::SeparatedSyntaxList
            (this_00,elements_00);
  keyword_00.rawLen = in_stack_fffffffffffffe1c;
  keyword_00.kind = (short)uVar4;
  keyword_00._2_1_ = (char)((uint)uVar4 >> 0x10);
  keyword_00.numFlags.raw = (char)((uint)uVar4 >> 0x18);
  keyword_00.info = (Info *)in_stack_fffffffffffffe20._M_extent_value;
  semi_00.info = pIVar2;
  semi_00.kind = (short)uVar5;
  semi_00._2_1_ = (char)((ulong)uVar5 >> 0x10);
  semi_00.numFlags.raw = (char)((ulong)uVar5 >> 0x18);
  semi_00.rawLen = (int)((ulong)uVar5 >> 0x20);
  pPVar3 = slang::syntax::SyntaxFactory::packageImportDeclaration
                     ((SyntaxFactory *)pvStack_30,local_38,keyword_00,
                      (SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *)0x8aa462,
                      semi_00);
  std::
  vector<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
  ::push_back(pvStack_30,(value_type *)local_38);
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x8aa4b5);
  return pPVar3;
}

Assistant:

PackageImportDeclarationSyntax& Parser::parseImportDeclaration(AttrList attributes) {
    auto keyword = consume();

    Token semi;
    SmallVector<TokenOrSyntax, 4> items;
    parseList<isIdentifierOrComma, isSemicolon>(items, TokenKind::Semicolon, TokenKind::Comma, semi,
                                                RequireItems::True, diag::ExpectedPackageImport,
                                                [this] { return &parsePackageImportItem(); });

    auto& result = factory.packageImportDeclaration(attributes, keyword, items.copy(alloc), semi);
    meta.packageImports.push_back(&result);
    return result;
}